

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

int unzGoToFilePos(unzFile file,unz_file_pos *file_pos)

{
  undefined1 local_30 [8];
  unz64_file_pos file_pos64;
  unz_file_pos *file_pos_local;
  unzFile file_local;
  
  if (file_pos == (unz_file_pos *)0x0) {
    file_local._4_4_ = -0x66;
  }
  else {
    local_30 = (undefined1  [8])file_pos->pos_in_zip_directory;
    file_pos64.pos_in_zip_directory = file_pos->num_of_file;
    file_pos64.num_of_file = (ZPOS64_T)file_pos;
    file_local._4_4_ = unzGoToFilePos64(file,(unz64_file_pos *)local_30);
  }
  return file_local._4_4_;
}

Assistant:

extern int ZEXPORT unzGoToFilePos(
    unzFile file,
    unz_file_pos* file_pos)
{
    unz64_file_pos file_pos64;
    if (file_pos == NULL)
        return UNZ_PARAMERROR;

    file_pos64.pos_in_zip_directory = file_pos->pos_in_zip_directory;
    file_pos64.num_of_file = file_pos->num_of_file;
    return unzGoToFilePos64(file, &file_pos64);
}